

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::DvpVerifySRBResources
          (PipelineStateGLImpl *this,ShaderResourceCacheArrayType *ResourceCaches,
          BaseBindingsArrayType *BaseBindings)

{
  ShaderResourcesGL *this_00;
  PipelineResourceSignatureImplType *pPVar1;
  TBindings *pTVar2;
  ulong uVar3;
  GLResourceAttribs *pGVar4;
  TextureInfo *Attribs;
  ImageInfo *Attribs_00;
  char (*Args_1) [49];
  pointer Args_1_00;
  Uint32 UVar5;
  ulong uVar6;
  Uint32 ShaderInd;
  HandleResourceHelper HandleResource;
  string msg_1;
  uint local_7c;
  string local_78;
  string local_58;
  ShaderResourceCacheArrayType *local_38;
  
  local_38 = ResourceCaches;
  PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  uVar3 = (ulong)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount;
  if (uVar3 != 0) {
    uVar6 = 0;
    do {
      pPVar1 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignature
                         (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,(Uint32)uVar6
                         );
      if ((pPVar1 != (PipelineResourceSignatureImplType *)0x0) &&
         ((pPVar1->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources != 0)) {
        pTVar2 = GetBaseBindings(this,(Uint32)uVar6);
        if (*(long *)pTVar2->_M_elems !=
            *(long *)((array<unsigned_short,_4UL> *)BaseBindings->_M_elems[0]._M_elems)->_M_elems) {
          FormatString<char[124]>
                    (&local_78,
                     (char (*) [124])
                     "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison."
                    );
          DebugAssertionFailed
                    (local_78._M_dataplus._M_p,"DvpVerifySRBResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x2e9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar6 = uVar6 + 1;
      BaseBindings = (BaseBindingsArrayType *)((long)BaseBindings + 8);
    } while (uVar3 != uVar6);
  }
  local_78.field_2._8_8_ = &local_7c;
  local_7c = 0;
  local_78.field_2._M_allocated_capacity =
       (size_type)
       (this->m_ResourceAttibutions).
       super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78._M_string_length = (size_type)local_38;
  Args_1 = (char (*) [49])
           ((long)(this->m_ShaderNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_ShaderNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_78._M_dataplus._M_p = (pointer)this;
  if ((char (*) [49])
      ((long)(this->m_ShaderResources).
             super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_ShaderResources).
             super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) != Args_1) {
    FormatString<char[26],char[49]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ShaderResources.size() == m_ShaderNames.size()",Args_1);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x313);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  uVar3 = (ulong)local_7c;
  Args_1_00 = (this->m_ShaderResources).
              super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->m_ShaderResources).
                            super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)Args_1_00 >> 4)) {
    do {
      this_00 = Args_1_00[uVar3].
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this_00->m_NumUniformBuffers != 0) {
        UVar5 = 0;
        do {
          pGVar4 = &ShaderResourcesGL::GetUniformBuffer(this_00,UVar5)->super_GLResourceAttribs;
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_(&local_78,pGVar4,RESOURCE_DIM_BUFFER,false);
          UVar5 = UVar5 + 1;
        } while (UVar5 < this_00->m_NumUniformBuffers);
      }
      if (this_00->m_NumTextures != 0) {
        UVar5 = 0;
        do {
          Attribs = ShaderResourcesGL::GetTexture(this_00,UVar5);
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_
                    (&local_78,&Attribs->super_GLResourceAttribs,Attribs->ResourceDim,
                     Attribs->IsMultisample);
          UVar5 = UVar5 + 1;
        } while (UVar5 < this_00->m_NumTextures);
      }
      if (this_00->m_NumImages != 0) {
        UVar5 = 0;
        do {
          Attribs_00 = ShaderResourcesGL::GetImage(this_00,UVar5);
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_
                    (&local_78,&Attribs_00->super_GLResourceAttribs,Attribs_00->ResourceDim,
                     Attribs_00->IsMultisample);
          UVar5 = UVar5 + 1;
        } while (UVar5 < this_00->m_NumImages);
      }
      if (this_00->m_NumStorageBlocks != 0) {
        UVar5 = 0;
        do {
          pGVar4 = &ShaderResourcesGL::GetStorageBlock(this_00,UVar5)->super_GLResourceAttribs;
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_(&local_78,pGVar4,RESOURCE_DIM_BUFFER,false);
          UVar5 = UVar5 + 1;
        } while (UVar5 < this_00->m_NumStorageBlocks);
      }
      local_7c = local_7c + 1;
      uVar3 = (ulong)local_7c;
      Args_1_00 = (this->m_ShaderResources).
                  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_ShaderResources).
                                   super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)Args_1_00 >> 4
                            ));
  }
  if ((pointer)local_78.field_2._M_allocated_capacity !=
      (this->m_ResourceAttibutions).
      super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[56]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"HandleResource.attrib_it == m_ResourceAttibutions.end()",
               (char (*) [56])Args_1_00);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x319);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void PipelineStateGLImpl::DvpVerifySRBResources(const ShaderResourceCacheArrayType& ResourceCaches,
                                                const BaseBindingsArrayType&        BaseBindings) const
{
    // Verify base bindings
    const auto SignCount = GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const auto* pSignature = GetResourceSignature(sign);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        DEV_CHECK_ERR(GetBaseBindings(sign) == BaseBindings[sign],
                      "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison.");
    }

    using AttribIter = std::vector<ResourceAttribution>::const_iterator;
    struct HandleResourceHelper
    {
        PipelineStateGLImpl const&          PSO;
        const ShaderResourceCacheArrayType& ResourceCaches;
        AttribIter                          attrib_it;
        Uint32&                             shader_ind;

        HandleResourceHelper(const PipelineStateGLImpl&          _PSO,
                             const ShaderResourceCacheArrayType& _ResourceCaches,
                             AttribIter                          _iter,
                             Uint32&                             _ind) :
            PSO{_PSO},
            ResourceCaches{_ResourceCaches},
            attrib_it{_iter},
            shader_ind{_ind}
        {}

        void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }

        void operator()(const ShaderResourcesGL::StorageBlockInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::UniformBufferInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::TextureInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
        void operator()(const ShaderResourcesGL::ImageInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
    };

    Uint32               ShaderInd = 0;
    HandleResourceHelper HandleResource{*this, ResourceCaches, m_ResourceAttibutions.begin(), ShaderInd};

    VERIFY_EXPR(m_ShaderResources.size() == m_ShaderNames.size());
    for (; ShaderInd < m_ShaderResources.size(); ++ShaderInd)
    {
        m_ShaderResources[ShaderInd]->ProcessConstResources(std::ref(HandleResource), std::ref(HandleResource),
                                                            std::ref(HandleResource), std::ref(HandleResource));
    }
    VERIFY_EXPR(HandleResource.attrib_it == m_ResourceAttibutions.end());
}